

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.h
# Opt level: O0

UBool __thiscall
icu_63::Normalizer2Impl::isTrailCC01ForCompBoundaryAfter(Normalizer2Impl *this,uint16_t norm16)

{
  UBool UVar1;
  uint16_t *puVar2;
  undefined1 local_21;
  undefined1 local_13;
  uint16_t norm16_local;
  Normalizer2Impl *this_local;
  
  UVar1 = isInert(norm16);
  local_13 = true;
  if (UVar1 == '\0') {
    UVar1 = isDecompNoAlgorithmic(this,norm16);
    if (UVar1 == '\0') {
      puVar2 = getMapping(this,norm16);
      local_21 = *puVar2 < 0x200;
    }
    else {
      local_21 = (norm16 & 6) < 3;
    }
    local_13 = local_21;
  }
  return local_13;
}

Assistant:

UBool isTrailCC01ForCompBoundaryAfter(uint16_t norm16) const {
        return isInert(norm16) || (isDecompNoAlgorithmic(norm16) ?
            (norm16 & DELTA_TCCC_MASK) <= DELTA_TCCC_1 : *getMapping(norm16) <= 0x1ff);
    }